

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registration.c
# Opt level: O0

void registration_service_update
               (registration_service_handle *rs,size_t slots_used,size_t slots_total)

{
  void *pvVar1;
  undefined4 uVar2;
  registration_service_priv *priv;
  size_t slots_total_local;
  size_t slots_used_local;
  registration_service_handle *rs_local;
  
  pvVar1 = rs->priv;
  mutex_lock((mutex_handle *)((long)pvVar1 + 0x20));
  if (*(uint *)((long)pvVar1 + 0x58) < 3) {
    uVar2 = 1;
    if (slots_total <= slots_used) {
      uVar2 = 2;
    }
    *(undefined4 *)((long)pvVar1 + 0x58) = uVar2;
    *(size_t *)((long)pvVar1 + 0x50) = slots_used;
    *(size_t *)((long)pvVar1 + 0x48) = slots_total;
    worker_wake((worker_handle *)((long)pvVar1 + 0x28));
  }
  mutex_unlock((mutex_handle *)((long)pvVar1 + 0x20));
  return;
}

Assistant:

void registration_service_update(struct registration_service_handle *rs,
				 size_t slots_used, size_t slots_total)
{
	struct registration_service_priv *priv = rs->priv;

	mutex_lock(&priv->mutex);
	if (priv->status < REGISTRATION_STATUS_OFF) {
		priv->status = slots_used >= slots_total ?
			       REGISTRATION_STATUS_BUSY :
			       REGISTRATION_STATUS_READY;
		priv->slots_used = slots_used;
		priv->slots_total = slots_total;
		worker_wake(&priv->worker);
	}
	mutex_unlock(&priv->mutex);
}